

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  bool forwarding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char *op_local;
  string local_70;
  string local_50;
  
  op_local = op;
  forwarding = should_forward(this,op0);
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op0,true);
  join<char_const*&,std::__cxx11::string>
            (&local_70,(spirv_cross *)&op_local,(char **)&local_50,ts_1);
  emit_op(this,result_type,result_id,&local_70,forwarding,false);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(op, to_enclosed_unpacked_expression(op0)), forward);
	inherit_expression_dependencies(result_id, op0);
}